

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv_reader_options.cpp
# Opt level: O3

bool duckdb::ParseBoolean(Value *value,string *loption)

{
  LogicalTypeId LVar1;
  pointer pVVar2;
  pointer pVVar3;
  pointer pcVar4;
  bool bVar5;
  vector<duckdb::Value,_true> *this;
  const_reference value_00;
  BinderException *pBVar6;
  Value local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  if (value->is_null == true) {
    pBVar6 = (BinderException *)__cxa_allocate_exception(0x10);
    local_c8.type_._0_8_ = (long)&local_c8 + 0x10;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_c8,"\"%s\" expects a non-null boolean value (e.g. TRUE or 1)","");
    local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
    pcVar4 = (loption->_M_dataplus)._M_p;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&local_48,pcVar4,pcVar4 + loption->_M_string_length);
    BinderException::BinderException<std::__cxx11::string>(pBVar6,(string *)&local_c8,&local_48);
    __cxa_throw(pBVar6,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
  }
  if ((value->type_).id_ != LIST) {
    LogicalType::LogicalType(&local_c8.type_,FLOAT);
    bVar5 = LogicalType::operator==(&value->type_,&local_c8.type_);
    if (bVar5) {
      LogicalType::~LogicalType(&local_c8.type_);
    }
    else {
      LogicalType::LogicalType((LogicalType *)&local_88,DOUBLE);
      bVar5 = LogicalType::operator==(&value->type_,(LogicalType *)&local_88);
      LVar1 = (value->type_).id_;
      LogicalType::~LogicalType((LogicalType *)&local_88);
      LogicalType::~LogicalType(&local_c8.type_);
      if (!bVar5 && LVar1 != DECIMAL) {
        LogicalType::LogicalType((LogicalType *)&local_88,BOOLEAN);
        Value::DefaultCastAs(&local_c8,value,(LogicalType *)&local_88,false);
        bVar5 = BooleanValue::Get(&local_c8);
        Value::~Value(&local_c8);
        LogicalType::~LogicalType((LogicalType *)&local_88);
        return bVar5;
      }
    }
    pBVar6 = (BinderException *)__cxa_allocate_exception(0x10);
    local_c8.type_._0_8_ = (long)&local_c8 + 0x10;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_c8,"\"%s\" expects a boolean value (e.g. TRUE or 1)","");
    local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
    pcVar4 = (loption->_M_dataplus)._M_p;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&local_68,pcVar4,pcVar4 + loption->_M_string_length);
    BinderException::BinderException<std::__cxx11::string>(pBVar6,(string *)&local_c8,&local_68);
    __cxa_throw(pBVar6,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
  }
  this = ListValue::GetChildren(value);
  pVVar2 = (this->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
           super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
           super__Vector_impl_data._M_start;
  pVVar3 = (this->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
           super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pVVar2 == pVVar3) {
    bVar5 = true;
  }
  else {
    if (0x40 < (ulong)((long)pVVar3 - (long)pVVar2)) {
      pBVar6 = (BinderException *)__cxa_allocate_exception(0x10);
      local_c8.type_._0_8_ = (long)&local_c8 + 0x10;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_c8,
                 "\"%s\" expects a single argument as a boolean value (e.g. TRUE or 1)","");
      local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
      pcVar4 = (loption->_M_dataplus)._M_p;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)&local_88,pcVar4,pcVar4 + loption->_M_string_length);
      BinderException::BinderException<std::__cxx11::string>(pBVar6,(string *)&local_c8,&local_88);
      __cxa_throw(pBVar6,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
    }
    value_00 = vector<duckdb::Value,_true>::operator[](this,0);
    bVar5 = ParseBoolean(value_00,loption);
  }
  return bVar5;
}

Assistant:

static bool ParseBoolean(const Value &value, const string &loption) {
	if (value.IsNull()) {
		throw BinderException("\"%s\" expects a non-null boolean value (e.g. TRUE or 1)", loption);
	}
	if (value.type().id() == LogicalTypeId::LIST) {
		auto &children = ListValue::GetChildren(value);
		return ParseBoolean(children, loption);
	}
	if (value.type() == LogicalType::FLOAT || value.type() == LogicalType::DOUBLE ||
	    value.type().id() == LogicalTypeId::DECIMAL) {
		throw BinderException("\"%s\" expects a boolean value (e.g. TRUE or 1)", loption);
	}
	return BooleanValue::Get(value.DefaultCastAs(LogicalType::BOOLEAN));
}